

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O0

CompiledFilter __thiscall
Rml::FilterDropShadow::CompileFilter(FilterDropShadow *this,Element *element)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  RenderManager *name;
  Element *in_RDX;
  unsigned_long extraout_RDX;
  float x;
  float y;
  CompiledFilter CVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_260;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  local_20b;
  key_compare local_20a;
  undefined1 local_209;
  Variant local_208;
  Variant local_1e0;
  Variant local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_f8;
  iterator local_b0;
  size_type local_a8;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a0;
  allocator<char> local_71;
  Dictionary local_70;
  undefined1 local_49;
  NumericValue local_48;
  NumericValue local_40;
  Vector2<float> local_38;
  Vector2f offset;
  float local_24;
  Element *pEStack_20;
  float sigma;
  Element *element_local;
  FilterDropShadow *this_local;
  CompiledFilter *filter;
  
  offset = *(Vector2f *)
            ((long)&(element->children).
                    super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4);
  pEStack_20 = in_RDX;
  element_local = element;
  this_local = this;
  local_24 = Element::ResolveLength(in_RDX,(NumericValue)offset);
  local_40 = *(NumericValue *)((long)&(element->super_EnableObserverPtr<Rml::Element>).block + 4);
  x = Element::ResolveLength(pEStack_20,local_40);
  local_48 = *(NumericValue *)&element->visible;
  y = Element::ResolveLength(pEStack_20,local_48);
  Vector2<float>::Vector2(&local_38,x,y);
  local_49 = 0;
  name = Element::GetRenderManager(pEStack_20);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"drop-shadow",&local_71);
  local_209 = 1;
  local_190 = &local_188;
  Variant::Variant<Rml::Colour<unsigned_char,255,false>const&,void>
            (&local_1b8,
             (Colour<unsigned_char,_255,_false> *)&element->super_EnableObserverPtr<Rml::Element>);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_188,(char (*) [6])0x712ff5,&local_1b8);
  local_190 = &local_140;
  Variant::Variant<Rml::Vector2<float>const&,void>(&local_1e0,&local_38);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[7],_Rml::Variant,_true>(&local_140,(char (*) [7])"offset",&local_1e0);
  local_190 = &local_f8;
  Variant::Variant<float_const&,void>(&local_208,&local_24);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_f8,(char (*) [6])0x712f29,&local_208);
  local_209 = 0;
  local_b0 = &local_188;
  local_a8 = 3;
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  ::allocator(&local_20b);
  init._M_len = local_a8;
  init._M_array = local_b0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_a0,init,&local_20a,&local_20b);
  RenderManager::CompileFilter((RenderManager *)this,(String *)name,&local_70);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_a0);
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  ::~allocator(&local_20b);
  local_260 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
               *)&local_b0;
  do {
    local_260 = local_260 + -1;
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::~pair(local_260);
  } while (local_260 != &local_188);
  Variant::~Variant(&local_208);
  Variant::~Variant(&local_1e0);
  Variant::~Variant(&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::allocator<char>::~allocator(&local_71);
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle =
       extraout_RDX;
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)this;
  return (CompiledFilter)CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>;
}

Assistant:

CompiledFilter FilterDropShadow::CompileFilter(Element* element) const
{
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	CompiledFilter filter = element->GetRenderManager()->CompileFilter("drop-shadow",
		Dictionary{{"color", Variant(color)}, {"offset", Variant(offset)}, {"sigma", Variant(sigma)}});

	return filter;
}